

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O0

void mf_repdata_grow_noms_array(MF_REPLACEMENT_DATA_t *rd)

{
  void *pvVar1;
  long in_RDI;
  size_t grow_factor;
  
  if (*(long *)(in_RDI + 0x30) == 0) {
    *(undefined8 *)(in_RDI + 0x30) = 0x80;
    pvVar1 = malloc(*(long *)(in_RDI + 0x30) << 4);
    *(void **)(in_RDI + 0x28) = pvVar1;
    *(undefined8 *)(in_RDI + 0x38) = 0;
  }
  else {
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 0x80;
    pvVar1 = realloc(*(void **)(in_RDI + 0x28),*(long *)(in_RDI + 0x30) << 4);
    *(void **)(in_RDI + 0x28) = pvVar1;
  }
  return;
}

Assistant:

static void mf_repdata_grow_noms_array (MF_REPLACEMENT_DATA_t *rd)
{
    const size_t grow_factor = 128;
    
    if (rd->noms_capacity == 0)
    {
        rd->noms_capacity = grow_factor;
        rd->noms = (struct mf_replacement_nominee *) malloc 
                (rd->noms_capacity * sizeof(struct mf_replacement_nominee));
        rd->noms_size = 0;
    }
    else
    {
        rd->noms_capacity += grow_factor;
        rd->noms = (struct mf_replacement_nominee *) realloc (rd->noms, 
                rd->noms_capacity * sizeof(struct mf_replacement_nominee));
    }
}